

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void __thiscall crnlib::task_pool::task_pool(task_pool *this)

{
  char *in_RCX;
  long maximumCount;
  long maximumCount_00;
  
  tsstack<crnlib::task_pool::task,_16U>::tsstack(&this->m_task_stack);
  this->m_num_threads = 0;
  semaphore::semaphore(&this->m_tasks_available,0,maximumCount,in_RCX);
  semaphore::semaphore(&this->m_all_tasks_completed,0,maximumCount_00,in_RCX);
  this->m_total_submitted_tasks = 0;
  this->m_total_completed_tasks = 0;
  this->m_exit_flag = 0;
  this->m_threads[0] = 0;
  this->m_threads[1] = 0;
  this->m_threads[2] = 0;
  this->m_threads[3] = 0;
  this->m_threads[4] = 0;
  this->m_threads[5] = 0;
  this->m_threads[6] = 0;
  this->m_threads[7] = 0;
  this->m_threads[8] = 0;
  this->m_threads[9] = 0;
  this->m_threads[10] = 0;
  this->m_threads[0xb] = 0;
  this->m_threads[0xc] = 0;
  this->m_threads[0xd] = 0;
  this->m_threads[0xe] = 0;
  this->m_threads[0xf] = 0;
  return;
}

Assistant:

task_pool::task_pool():
        m_num_threads(0),
        m_tasks_available(0, 32767),
        m_all_tasks_completed(0, 1),
        m_total_submitted_tasks(0),
        m_total_completed_tasks(0),
        m_exit_flag(false)
    {
        utils::zero_object(m_threads);
    }